

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifssc(bifcxdef *ctx,int argc)

{
  long lVar1;
  runcxdef *ctx_00;
  int in_ESI;
  long in_RDI;
  uchar *p;
  char buf [80];
  int s2;
  int s1;
  undefined8 in_stack_ffffffffffffff78;
  int err;
  runcxdef *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  bifcxdef *in_stack_ffffffffffffffb0;
  
  err = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if ((in_ESI == 1) && (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x03')) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffff80,err);
    }
    bifcstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
            in_stack_ffffffffffffff98);
    os_strsc(&stack0xffffffffffffff98);
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffff80,err);
    }
    ctx_00 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(ctx_00,err);
    }
    os_score((int)ctx_00,(int)*(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8));
  }
  return;
}

Assistant:

void bifssc(bifcxdef *ctx, int argc)
{
    int s1, s2;

    /* optional new way - string argument */
    if (argc == 1 && runtostyp(ctx->bifcxrun) == DAT_SSTRING)
    {
        char   buf[80];
        uchar *p;
        
        p = runpopstr(ctx->bifcxrun);
        bifcstr(ctx, buf, (size_t)sizeof(buf), p);
        tiostrsc(ctx->bifcxtio, buf);
    }
    else
    {
        /* old way - two numeric arguments (displays: x/y) */
        bifcntargs(ctx, 2, argc);
        s1 = runpopnum(ctx->bifcxrun);
        s2 = runpopnum(ctx->bifcxrun);
        tioscore(ctx->bifcxtio, s1, s2);
    }
}